

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,int row,bool on)

{
  QFormLayoutItem *this_00;
  QFormLayoutItem *this_01;
  pointer ppQVar1;
  QFormLayoutItem **ppQVar2;
  QList<QFormLayoutItem_*> *this_02;
  bool bVar3;
  
  this_02 = (QList<QFormLayoutItem_*> *)(*(long *)&(this->super_QLayout).field_0x8 + 0xc0);
  ppQVar1 = QList<QFormLayoutItem_*>::data(this_02);
  this_00 = ppQVar1[row * 2];
  ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)this_02,row,1);
  this_01 = *ppQVar2;
  if (this_00 == (QFormLayoutItem *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = this_00->isVisible != on;
    QFormLayoutItem::setVisible(this_00,on);
  }
  if (this_01 != (QFormLayoutItem *)0x0) {
    bVar3 = (bool)(bVar3 | this_01->isVisible != on);
    QFormLayoutItem::setVisible(this_01,on);
  }
  if (bVar3) {
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

void QFormLayout::setRowVisible(int row, bool on)
{
    Q_D(QFormLayout);
    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);
    bool change = false;
    if (label) {
        change = label->isVisible != on;
        label->setVisible(on);
    }
    if (field) {
        change |= field->isVisible != on;
        field->setVisible(on);
    }
    if (change)
        invalidate();
}